

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O3

void __thiscall
slang::ast::TypePrinter::visit(TypePrinter *this,AssociativeArrayType *type,string_view param_2)

{
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  if ((this->options).anonymousTypeStyle == FriendlyName) {
    ::fmt::v11::detail::buffer<char>::append<char>
              ((buffer<char> *)
               (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,
               "associative array [","");
    if (type->indexType == (Type *)0x0) {
      ::fmt::v11::detail::buffer<char>::append<char>
                ((buffer<char> *)
                 (this->buffer)._M_t.
                 super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
                 .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,"*","");
    }
    else {
      local_20._M_len = 0;
      local_20._M_str = "";
      Symbol::visit<slang::ast::TypePrinter&,std::basic_string_view<char,std::char_traits<char>>>
                (&type->indexType->super_Symbol,this,&local_20);
    }
    ::fmt::v11::detail::buffer<char>::append<char>
              ((buffer<char> *)
               (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,"] of ","");
    local_20._M_len = 0;
    local_20._M_str = "";
    Symbol::visit<slang::ast::TypePrinter&,std::basic_string_view<char,std::char_traits<char>>>
              (&type->elementType->super_Symbol,this,&local_20);
    return;
  }
  printUnpackedArray(this,&type->super_Type);
  return;
}

Assistant:

void TypePrinter::visit(const AssociativeArrayType& type, std::string_view) {
    if (options.anonymousTypeStyle == TypePrintingOptions::FriendlyName) {
        buffer->append("associative array [");
        if (type.indexType)
            type.indexType->visit(*this, ""sv);
        else
            buffer->append("*");

        buffer->append("] of ");
        type.elementType.visit(*this, ""sv);
    }
    else {
        printUnpackedArray(type);
    }
}